

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O0

char nivalis::OpCode::to_char(uint32_t opcode)

{
  uint32_t opcode_local;
  char local_1;
  
  switch(opcode) {
  case 0x20:
    local_1 = '+';
    break;
  case 0x21:
    local_1 = '-';
    break;
  default:
    local_1 = '\0';
    break;
  case 0x30:
    local_1 = '*';
    break;
  case 0x31:
    local_1 = '/';
    break;
  case 0x32:
    local_1 = '%';
    break;
  case 0x40:
    local_1 = '^';
    break;
  case 0x52:
    local_1 = '&';
    break;
  case 0x53:
    local_1 = '|';
    break;
  case 0x60:
    local_1 = '<';
    break;
  case 0x62:
    local_1 = '=';
    break;
  case 0x65:
    local_1 = '>';
  }
  return local_1;
}

Assistant:

char to_char(uint32_t opcode) {
    switch (opcode) {
        case OpCode::add: return '+';
        case OpCode::sub: return '-';
        case OpCode::mul: return '*';
        case OpCode::divi: return '/';
        case OpCode::mod: return '%';
        case OpCode::power: return '^';
        case OpCode::lt: return '<';
        case OpCode::gt: return '>';
        case OpCode::eq: return '=';
        case OpCode::land: return '&';
        case OpCode::lor: return '|';
        default: return 0;
    };
}